

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerWrite(PgHdr *pPg)

{
  u32 i;
  Pager *pPVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  DbPage *pPg_00;
  sqlite3_file *pJfd;
  uint uVar6;
  long lVar7;
  uint uVar8;
  Pgno pgno;
  int iVar9;
  uint uVar10;
  bool bVar11;
  DbPage *pDStack_40;
  PgHdr *pPStack_38;
  
  pPVar1 = pPg->pPager;
  if (((pPg->flags & 4) != 0) &&
     (pPStack_38 = (PgHdr *)(ulong)pPVar1->dbSize, pPg->pgno <= pPVar1->dbSize)) {
    if (pPVar1->nSavepoint == 0) {
      return 0;
    }
    pPVar1 = pPg->pPager;
    uVar10 = pPg->pgno;
    uVar5 = (ulong)(uint)pPVar1->nSavepoint;
    if (pPVar1->nSavepoint < 1) {
      uVar5 = 0;
    }
    lVar7 = 0;
    do {
      if (uVar5 * 0x30 - lVar7 == 0) {
        return 0;
      }
      if (uVar10 <= *(uint *)((long)pPVar1->aSavepoint->aWalData + lVar7 + -8)) {
        pDStack_40 = (DbPage *)0x133189;
        iVar3 = sqlite3BitvecTestNotNull
                          (*(Bitvec **)((long)pPVar1->aSavepoint->aWalData + lVar7 + -0x10),uVar10);
        if (iVar3 == 0) {
          if (pPVar1->journalMode != '\x02') {
            pJfd = pPVar1->sjfd;
            if (pJfd->pMethods == (sqlite3_io_methods *)0x0) {
              if ((pPVar1->journalMode == '\x04') ||
                 (iVar3 = sqlite3Config.nStmtSpill, pPVar1->subjInMemory != '\0')) {
                iVar3 = -1;
              }
              pDStack_40 = (DbPage *)0x133227;
              iVar3 = sqlite3JournalOpen(pPVar1->pVfs,(char *)0x0,pJfd,0x201e,iVar3);
              if (iVar3 != 0) {
                return iVar3;
              }
              pJfd = pPVar1->sjfd;
              uVar10 = pPg->pgno;
            }
            pvVar2 = pPg->pData;
            lVar7 = ((long)pPVar1->pageSize + 4) * (ulong)pPVar1->nSubRec;
            pDStack_40 = (DbPage *)0x1331e2;
            iVar3 = write32bits(pJfd,lVar7,uVar10);
            if (iVar3 != 0) {
              return iVar3;
            }
            pDStack_40 = (DbPage *)0x133200;
            iVar3 = (*pPVar1->sjfd->pMethods->xWrite)
                              (pPVar1->sjfd,pvVar2,pPVar1->pageSize,lVar7 + 4);
            if (iVar3 != 0) {
              return iVar3;
            }
            uVar10 = pPg->pgno;
          }
          pPVar1->nSubRec = pPVar1->nSubRec + 1;
          iVar3 = addToSavepointBitvecs(pPVar1,uVar10);
          return iVar3;
        }
      }
      lVar7 = lVar7 + 0x30;
    } while( true );
  }
  if (pPVar1->errCode != 0) {
    return pPVar1->errCode;
  }
  if (pPVar1->sectorSize <= (uint)pPVar1->pageSize) {
    iVar3 = pager_write(pPg);
    return iVar3;
  }
  pPVar1 = pPg->pPager;
  uVar10 = pPVar1->dbSize;
  uVar4 = pPVar1->sectorSize / (uint)pPVar1->pageSize;
  pPVar1->doNotSpill = pPVar1->doNotSpill | 4;
  uVar6 = pPg->pgno;
  uVar8 = -uVar4 & uVar6 - 1;
  if (uVar10 < uVar6) {
    uVar6 = uVar6 - uVar8;
  }
  else {
    uVar6 = uVar10 - uVar8;
    if (uVar8 + uVar4 <= uVar10) {
      uVar6 = uVar4;
    }
  }
  pgno = uVar8 + 1;
  bVar11 = false;
  iVar9 = 0;
  iVar3 = 0;
  pPStack_38 = pPg;
  do {
    if (((int)uVar6 <= iVar9) || (iVar3 != 0)) {
      if ((iVar3 == 0) && (bVar11)) {
        uVar10 = 0;
        if (0 < (int)uVar6) {
          uVar10 = uVar6;
        }
        while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
          pPg_00 = sqlite3PagerLookup(pPVar1,pgno);
          if (pPg_00 != (DbPage *)0x0) {
            *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
            sqlite3PagerUnrefNotNull(pPg_00);
          }
          pgno = pgno + 1;
        }
      }
      pPVar1->doNotSpill = pPVar1->doNotSpill & 0xfb;
      return iVar3;
    }
    i = pgno + iVar9;
    if ((i == pPStack_38->pgno) || (iVar3 = sqlite3BitvecTest(pPVar1->pInJournal,i), iVar3 == 0)) {
      iVar3 = 0;
      if ((i != sqlite3PendingByte / pPVar1->pageSize + 1U) &&
         (iVar3 = (*pPVar1->xGet)(pPVar1,i,&pDStack_40,0), iVar3 == 0)) {
        iVar3 = pager_write(pDStack_40);
        if ((pDStack_40->flags & 8) != 0) {
          bVar11 = true;
        }
        goto LAB_001398a6;
      }
    }
    else {
      pDStack_40 = sqlite3PagerLookup(pPVar1,i);
      iVar3 = 0;
      if (pDStack_40 != (DbPage *)0x0) {
        if ((pDStack_40->flags & 8) != 0) {
          bVar11 = true;
        }
LAB_001398a6:
        sqlite3PagerUnrefNotNull(pDStack_40);
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}